

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::Transform(ON_Brep *this,ON_Xform *xform)

{
  ON_Object *this_00;
  ON_BrepFace *this_01;
  double t;
  ON_Curve *pOVar1;
  ON_BrepVertex *pOVar2;
  ON_BrepEdge *pOVar3;
  ON_BrepFace *pOVar4;
  long lVar5;
  double dVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ON_PlaneSurface *pOVar13;
  ON_NurbsSurface *nurbs_srf;
  double *pdVar14;
  ulong uVar15;
  ON_Surface *pOVar16;
  __shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *p_Var17;
  ulong uVar18;
  ON_BoundingBox *this_02;
  ON_Xform *pOVar19;
  ON_3dPoint *pOVar20;
  uint uVar21;
  ON_Mesh *pMesh;
  ulong uVar22;
  int vi;
  long lVar23;
  byte bVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  ON_3fVector OVar27;
  double local_168;
  double local_128;
  ON_3dPoint Q;
  ON_Interval v;
  ON_Interval u;
  ON_3dPoint P;
  double dStack_98;
  double local_90;
  double dStack_88;
  
  bVar24 = 0;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])();
  iVar11 = ON_Xform::IsSimilarity(xform);
  local_168 = ON_Xform::Determinant(xform,(double *)0x0);
  uVar25 = 0;
  uVar26 = 0x3ff00000;
  local_128 = 1.0;
  if (iVar11 != 0) {
    uVar25 = 0;
    uVar26 = 0;
    if (((local_168 != 0.0) || (NAN(local_168))) && (bVar7 = ON_IsValid(local_168), bVar7)) {
      uVar25 = (undefined4)DAT_00690010;
      uVar26 = DAT_00690010._4_4_;
      dVar6 = (double)((ulong)local_168 & (ulong)DAT_00690010);
      if (1e-06 < (double)((ulong)(dVar6 + -1.0) & (ulong)DAT_00690010)) {
        uVar25 = 0x55555555;
        uVar26 = 0x3fd55555;
        local_128 = pow(dVar6,0.3333333333333333);
      }
    }
  }
  if (iVar11 != 1) {
    this->m_is_solid = 0;
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  uVar21 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar22 = 0;
  uVar15 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar15 = uVar22;
  }
  bVar7 = true;
  for (; uVar15 != uVar22; uVar22 = uVar22 + 1) {
    pOVar1 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar22];
    if (pOVar1 != (ON_Curve *)0x0) {
      iVar12 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])();
      bVar7 = (bool)(bVar7 & (byte)iVar12);
    }
  }
  uVar21 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  uVar22 = 0;
  uVar15 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar15 = uVar22;
  }
  do {
    if (uVar22 == uVar15) {
      uVar21 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_count;
      uVar22 = 0;
      uVar15 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar15 = uVar22;
      }
      for (; uVar15 * 0x58 - uVar22 != 0; uVar22 = uVar22 + 0x58) {
        pOVar2 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                 m_a;
        bVar8 = (**(code **)(*(long *)((long)&(pOVar2->super_ON_Point).super_ON_Geometry.
                                              super_ON_Object._vptr_ON_Object + uVar22) + 0xe0))
                          ((long)&(pOVar2->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                  _vptr_ON_Object + uVar22,xform);
        bVar7 = (bool)(bVar7 & bVar8);
      }
      uVar21 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
               m_count;
      uVar22 = 0;
      uVar15 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar15 = uVar22;
      }
      for (; uVar15 * 0x88 - uVar22 != 0; uVar22 = uVar22 + 0x88) {
        pOVar3 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        this_00 = (ON_Object *)
                  ((long)&(((ON_CurveProxy *)
                           (&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))->
                          super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + uVar22
                  );
        ON_Object::TransformUserData(this_00,xform);
        dVar6 = *(double *)((long)pOVar3->m_vi + uVar22 + 0x24);
        if (0.0 < dVar6 && (0.0 < local_128 && local_128 != 1.0)) {
          this_00[7].m_userdata_list = (ON_UserData *)(dVar6 * local_128);
        }
      }
      uVar21 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
               m_count;
      local_168 = ABS(local_168);
      uVar15 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar15 = 0;
      }
      for (uVar22 = 0; uVar22 != uVar15; uVar22 = uVar22 + 1) {
        pOVar4 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
        this_01 = pOVar4 + uVar22;
        ON_Object::TransformUserData((ON_Object *)this_01,xform);
        this_02 = &pOVar4[uVar22].m_bbox;
        ON_BoundingBox::Destroy(this_02);
        ON_Geometry::BoundingBox((ON_BoundingBox *)&P,(ON_Geometry *)this_01);
        pOVar4[uVar22].m_bbox.m_max.y = local_90;
        pOVar4[uVar22].m_bbox.m_max.z = dStack_88;
        pOVar4[uVar22].m_bbox.m_min.z = P.z;
        pOVar4[uVar22].m_bbox.m_max.x = dStack_98;
        (this_02->m_min).x = P.x;
        pOVar4[uVar22].m_bbox.m_min.y = P.y;
        if (pOVar4[uVar22].m_face_index != -1) {
          ON_BoundingBox::Union(&this->m_bbox,this_02);
        }
        bVar10 = true;
        if (1.490116119385e-08 < local_168) {
          pdVar14 = ON_Xform::operator[](xform,3);
          if ((*pdVar14 == 0.0) && (!NAN(*pdVar14))) {
            pdVar14 = ON_Xform::operator[](xform,3);
            if ((pdVar14[1] == 0.0) && (!NAN(pdVar14[1]))) {
              pdVar14 = ON_Xform::operator[](xform,3);
              if ((pdVar14[2] == 0.0) && (!NAN(pdVar14[2]))) {
                pdVar14 = ON_Xform::operator[](xform,3);
                bVar10 = pdVar14[3] != 1.0;
              }
            }
          }
        }
        pOVar16 = ON_BrepFace::SurfaceOf(this_01);
        if (pOVar16 == (ON_Surface *)0x0) {
          bVar10 = false;
        }
        p_Var17 = &ON_BrepFace::UniqueMesh(this_01,render_mesh)->
                   super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&P,p_Var17);
        dVar6 = P.x;
        if (P.x != 0.0) {
          if ((bVar10) && (bVar9 = ON_Mesh::EvaluateMeshGeometry((ON_Mesh *)P.x,pOVar16), bVar9)) {
            if (this_01->m_bRev == true) {
              uVar18 = (ulong)*(uint *)((long)dVar6 + 0x140);
              if ((int)*(uint *)((long)dVar6 + 0x140) < 1) {
                uVar18 = 0;
              }
              for (lVar23 = 0; uVar18 * 0xc - lVar23 != 0; lVar23 = lVar23 + 0xc) {
                OVar27 = ON_3fVector::operator-
                                   ((ON_3fVector *)(*(long *)((long)dVar6 + 0x138) + lVar23));
                lVar5 = *(long *)((long)dVar6 + 0x138);
                *(long *)(lVar5 + lVar23) = OVar27._0_8_;
                *(float *)(lVar5 + 8 + lVar23) = OVar27.z;
              }
            }
          }
          else {
            (**(code **)(*(long *)dVar6 + 0xe0))(dVar6,xform);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&P.y);
        p_Var17 = &ON_BrepFace::UniqueMesh(this_01,analysis_mesh)->
                   super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&Q,p_Var17);
        dVar6 = Q.x;
        if (Q.x != 0.0) {
          bVar9 = bVar10;
          if (!bVar10) {
            pOVar19 = xform;
            pOVar20 = &P;
            for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
              (*(double (*) [4])&pOVar20->x)[0] = pOVar19->m_xform[0][0];
              pOVar19 = (ON_Xform *)((long)pOVar19 + ((ulong)bVar24 * -2 + 1) * 8);
              pOVar20 = (ON_3dPoint *)((long)pOVar20 + (ulong)bVar24 * -0x10 + 8);
            }
            dStack_98 = 0.0;
            iVar11 = ON_Xform::IsSimilarity((ON_Xform *)&P);
            if (iVar11 != 1) {
              bVar9 = true;
            }
          }
          if (((pOVar16 == (ON_Surface *)0x0) || (!bVar9)) ||
             (bVar9 = ON_Mesh::EvaluateMeshGeometry((ON_Mesh *)dVar6,pOVar16), !bVar9)) {
            (**(code **)(*(long *)dVar6 + 0xe0))(dVar6,xform);
          }
          else if (this_01->m_bRev == true) {
            uVar18 = (ulong)*(uint *)((long)dVar6 + 0x140);
            if ((int)*(uint *)((long)dVar6 + 0x140) < 1) {
              uVar18 = 0;
            }
            for (lVar23 = 0; uVar18 * 0xc - lVar23 != 0; lVar23 = lVar23 + 0xc) {
              OVar27 = ON_3fVector::operator-
                                 ((ON_3fVector *)(*(long *)((long)dVar6 + 0x138) + lVar23));
              lVar5 = *(long *)((long)dVar6 + 0x138);
              *(long *)(lVar5 + lVar23) = OVar27._0_8_;
              *(float *)(lVar5 + 8 + lVar23) = OVar27.z;
            }
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&Q.y);
        p_Var17 = &ON_BrepFace::UniqueMesh(this_01,preview_mesh)->
                   super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&P,p_Var17);
        dVar6 = P.x;
        if (P.x != 0.0) {
          if ((bVar10) && (bVar10 = ON_Mesh::EvaluateMeshGeometry((ON_Mesh *)P.x,pOVar16), bVar10))
          {
            if (this_01->m_bRev == true) {
              uVar18 = (ulong)*(uint *)((long)dVar6 + 0x140);
              if ((int)*(uint *)((long)dVar6 + 0x140) < 1) {
                uVar18 = 0;
              }
              for (lVar23 = 0; uVar18 * 0xc - lVar23 != 0; lVar23 = lVar23 + 0xc) {
                OVar27 = ON_3fVector::operator-
                                   ((ON_3fVector *)(*(long *)((long)dVar6 + 0x138) + lVar23));
                lVar5 = *(long *)((long)dVar6 + 0x138);
                *(long *)(lVar5 + lVar23) = OVar27._0_8_;
                *(float *)(lVar5 + 8 + lVar23) = OVar27.z;
              }
            }
          }
          else {
            (**(code **)(*(long *)dVar6 + 0xe0))(dVar6,xform);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&P.y);
      }
      ON_Object::TransformUserData((ON_Object *)this,xform);
      return bVar7;
    }
    pOVar16 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar22];
    if (pOVar16 != (ON_Surface *)0x0) {
      if (iVar11 == 0) {
        iVar12 = (*(pOVar16->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2b])(pOVar16,0);
        if (iVar12 == 1) {
          pOVar16 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar22];
          iVar12 = (*(pOVar16->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2b])(pOVar16,1);
          if ((iVar12 != 1) ||
             (pOVar13 = ON_PlaneSurface::Cast
                                  ((ON_Object *)
                                   (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar22]),
             pOVar13 == (ON_PlaneSurface *)0x0)) goto LAB_0041267c;
          nurbs_srf = ON_NurbsSurface::New();
          pOVar16 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar22];
          iVar12 = (*(pOVar16->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                             (0,pOVar16,nurbs_srf);
          if (iVar12 == 0) {
            if (nurbs_srf == (ON_NurbsSurface *)0x0) goto LAB_0041270b;
          }
          else {
            iVar12 = (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                       _vptr_ON_Object[0x1c])(nurbs_srf,xform);
            if ((char)iVar12 != '\0') goto LAB_00412713;
          }
          (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                    (nurbs_srf);
        }
LAB_0041270b:
        nurbs_srf = (ON_NurbsSurface *)0x0;
      }
      else {
LAB_0041267c:
        nurbs_srf = (ON_NurbsSurface *)0x0;
      }
LAB_00412713:
      iVar12 = (*((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar22]->super_ON_Geometry).
                 super_ON_Object._vptr_ON_Object[0x1c])();
      if ((char)iVar12 == '\0') {
        if (nurbs_srf == (ON_NurbsSurface *)0x0) {
          bVar7 = false;
        }
        else {
          ON_BrepTransformSwapSrfHelper(this,nurbs_srf,(int)uVar22);
        }
      }
      else if (nurbs_srf != (ON_NurbsSurface *)0x0) {
        uVar21 = 0;
        (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (nurbs_srf,0);
        u.m_t[1] = (double)CONCAT44(uVar26,uVar25);
        (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (nurbs_srf);
        v.m_t[1] = (double)CONCAT44(uVar26,uVar25);
        while ((uVar21 < 2 && (nurbs_srf != (ON_NurbsSurface *)0x0))) {
          for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
            pdVar14 = ON_Interval::operator[](&u,uVar21);
            dVar6 = *pdVar14;
            pdVar14 = ON_Interval::operator[](&v,iVar12);
            ON_Surface::PointAt(&P,&nurbs_srf->super_ON_Surface,dVar6,*pdVar14);
            pOVar16 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar22];
            pdVar14 = ON_Interval::operator[](&u,uVar21);
            dVar6 = *pdVar14;
            pdVar14 = ON_Interval::operator[](&v,iVar12);
            t = *pdVar14;
            uVar25 = SUB84(t,0);
            uVar26 = (undefined4)((ulong)t >> 0x20);
            ON_Surface::PointAt(&Q,pOVar16,dVar6,t);
            dVar6 = ON_3dPoint::DistanceTo(&P,&Q);
            if (2.3283064365386963e-10 < dVar6) {
              ON_BrepTransformSwapSrfHelper(this,nurbs_srf,(int)uVar22);
              nurbs_srf = (ON_NurbsSurface *)0x0;
              break;
            }
          }
          uVar21 = uVar21 + 1;
        }
        if (nurbs_srf != (ON_NurbsSurface *)0x0) {
          (*(nurbs_srf->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                    (nurbs_srf);
        }
      }
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

bool ON_Brep::Transform( const ON_Xform& xform )
{
  int i, count;
  bool rc = true;
  
  DestroyRuntimeCache();

  int is_similarity = xform.IsSimilarity();
  const double det = xform.Determinant();
  bool bUniformScale = (0 != is_similarity && det != 0.0 && ON_IsValid(det) && fabs(fabs(det) - 1.0) > 1.0e-6);
  const double uniform_scale = bUniformScale ? pow(fabs(det), 1.0 / 3.0) : 1.0;

  if ( 1 != is_similarity )
  {
    // this will cause the solid flag to be
    // recaclulated the next time it is needed.
    m_is_solid = 0;
  }


  // 13 Feb 2003 Dale Lear:
  // Transforming the bbox makes it grow too large under repeated
  // rotations.  So, we will destroy it here and reset it below.
  //m_bbox.Transform(xform);
  m_bbox.Destroy();

  count = m_C3.Count();
  for ( i = 0; i < count; i++ ) 
  {
    if ( m_C3[i] ) 
    {
      if ( !m_C3[i]->Transform(xform) )
        rc = false;
    }
  }

  count = m_S.Count();
  for ( i = 0; i < count; i++ ) {
    if ( m_S[i] ) 
    
    {
      ON_NurbsSurface* nurbs_srf = 0;
      if ( !is_similarity )
      {
        if (    1 == m_S[i]->Degree(0) // degree tests reduce calls to
             && 1 == m_S[i]->Degree(1) // slow ON_PlaneSurface::Cast()
             && 0 != ON_PlaneSurface::Cast(m_S[i]) )
        {
          nurbs_srf = ON_NurbsSurface::New();
          if ( !m_S[i]->GetNurbForm(*nurbs_srf) )
          {
            delete nurbs_srf;
            nurbs_srf = 0;
          }
          else if ( !nurbs_srf->Transform(xform) )
          {
            delete nurbs_srf;
            nurbs_srf = 0;
          }
        }
      }

      if ( !m_S[i]->Transform(xform) )
      {
        if ( nurbs_srf )
        {
          ON_BrepTransformSwapSrfHelper(*this,nurbs_srf,i);
          nurbs_srf = 0;
        }
        else
        {
          rc = false;
        }
      }
      else if ( nurbs_srf )
      {
        // make sure transformation was good
        ON_Interval u = nurbs_srf->Domain(0);
        ON_Interval v = nurbs_srf->Domain(1);
        for ( int ui = 0; ui < 2 && nurbs_srf; ui++ ) for (int vi = 0; vi < 2 && nurbs_srf; vi++)
        {
          ON_3dPoint P = nurbs_srf->PointAt(u[ui],v[vi]);
          ON_3dPoint Q = m_S[i]->PointAt(u[ui],v[vi]);
          if ( P.DistanceTo(Q) > ON_ZERO_TOLERANCE )
          {
            ON_BrepTransformSwapSrfHelper(*this,nurbs_srf,i);
            nurbs_srf = 0;
            break;
          }
        }
        if ( nurbs_srf )
        {
          delete nurbs_srf;
          nurbs_srf = 0;
        }
      }
    }
  }

  count = m_V.Count();
  for ( i = 0; i < count; i++ ) {
    if ( !m_V[i].Transform(xform) )
      rc = false;
  }

  count = m_E.Count();
  for ( i = 0; i < count; i++ ) {
    ON_BrepEdge& edge = m_E[i];
    edge.TransformUserData(xform);
    // 2014-05-13 Dale Lear RH-26852
    //   Based on a conversation with Chuck, we will
    //   test scaling edge tolerances.  The bug
    //   bailed down to a unit system change from a 
    //   "long" unit to mm made a valid brep invalid
    //   because the edge tolerances were too small.
    //   This fix does ot handle non-uniform scaling.
    //   In the case of a non-uniform scale, the edge
    //   tolerance should be recalculated.
    if (edge.m_tolerance > 0.0 && uniform_scale > 0.0 && uniform_scale != 1.0)
    {
      edge.m_tolerance *= uniform_scale;
    }
  }

  count = m_F.Count();
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepFace& face = m_F[i];
    face.TransformUserData(xform);

    // 13 Feb 2003 Dale Lear:
    // Transforming the bbox makes it grow too large under repeated
    // rotations.  So, we need to reset it.
    face.m_bbox.Destroy();

    //GBA 20 May 2020. Brep box now computed from face boxes, instead of surface boxes.
    face.m_bbox = face.BoundingBox();    
    if ( face.m_face_index != -1 )
      m_bbox.Union( face.m_bbox );
    

    // 12 May 2003 Dale Lear - RR 10528
    //     Use surface evaluation to update rendermesh when 
    //     calling ON_Mesh::Transform() will map mesh normals
    //     to some thing different that the "true" surface
    //     normal.
    bool bEvMesh = ( fabs(det) <= ON_SQRT_EPSILON
                     || xform[3][0] != 0.0
                     || xform[3][1] != 0.0
                     || xform[3][2] != 0.0
                     || xform[3][3] != 1.0
                     );
    const ON_Surface* srf = face.SurfaceOf();

    if ( 0 == srf )
      bEvMesh = false;

    //Render meshes
    {
      auto spMesh = face.UniqueMesh(ON::render_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());

        if ( bEvMesh && pMesh->EvaluateMeshGeometry(*srf) )
        {
          if ( face.m_bRev )
          {
            // 29 September 2003 Dale Lear
            //     Normals on render meshes (and face orientations)
            //     take face.m_bRev into account so that two sided
            //     materials work as expected.  EvaluateMeshGeometry()
            //     does not take face.m_bRev into account, so we need
            //     to reverse the face normals here.
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }

    //Analysis meshes
    {
      auto spMesh = face.UniqueMesh(ON::analysis_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());

        // Dale Lear 30 March 2009 - bug 46766
        //   Evaluate analysis meshes when the transform involves scaling
        //   so curvature values are properly updated.
        bool bEvAnalysisMesh = bEvMesh;
        if ( !bEvAnalysisMesh )
        {
          ON_Xform tmp(xform);
          tmp.m_xform[0][3] = 0.0;
          tmp.m_xform[1][3] = 0.0;
          tmp.m_xform[2][3] = 0.0;
          if ( 1 != tmp.IsSimilarity() )
            bEvAnalysisMesh = true;
        }
        // 1 Sept 2021, Mikko, RH-65468:
        // Added null check to prevent a crash.
        if ( bEvAnalysisMesh && nullptr != srf && pMesh->EvaluateMeshGeometry(*srf) )
        {
          // 28 Sept 2012, Mikko:
          // Apply the "29 September 2003 Dale Lear" fix above also to analysis meshes.
          if ( face.m_bRev )
          {
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }

    //Preview meshes
    {
      auto spMesh = face.UniqueMesh(ON::preview_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());
        if ( bEvMesh && pMesh->EvaluateMeshGeometry(*srf) )
        {
          if ( face.m_bRev )
          {
            // 10 June 2021, Mikko, RH-64582:
            // Fixed typo that caused a crash, changed "m_analysis_mesh" to "m_preview_mesh".
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }
  }

  // The call to transform user data needs to be last
  // so that the rest of the brep is in position.
  // In particular, ON_BrepRegionTopologyUserData::Transform
  // assumes the face bounding boxes are up to date.
  TransformUserData(xform);

  return rc;
}